

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cpp
# Opt level: O1

void Al::internal::trace::record_pe_done(AlState *state)

{
  return;
}

Assistant:

void record_pe_done(const AlState& state) {
#ifdef AL_TRACE
  std::stringstream ss;
  ss << get_time() << ": PE DONE "
     << state.get_name() << " "
     << state.get_desc();
  save_trace_entry(ss.str(), true);
#else
  (void) state;
#endif
}